

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O0

ssize_t compress_filter_read(archive_read_filter *self,void **pblock)

{
  void *pvVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  int ret;
  uchar *end;
  uchar *start;
  uchar *p;
  private_data *state;
  void **pblock_local;
  archive_read_filter *self_local;
  
  pvVar1 = self->data;
  if (*(int *)((long)pvVar1 + 0x3c) == 0) {
    puVar2 = *(uchar **)((long)pvVar1 + 0x30);
    lVar3 = *(long *)((long)pvVar1 + 0x28);
    start = puVar2;
    do {
      while( true ) {
        while( true ) {
          bVar6 = false;
          if (start < puVar2 + lVar3) {
            bVar6 = *(int *)((long)pvVar1 + 0x3c) == 0;
          }
          if (!bVar6) {
            *pblock = puVar2;
            return (ssize_t)(start + -(long)puVar2);
          }
          if (*(ulong *)((long)pvVar1 + 0x30060) <= (long)pvVar1 + 0x30068U) break;
          lVar4 = *(long *)((long)pvVar1 + 0x30060);
          *(long *)((long)pvVar1 + 0x30060) = lVar4 + -1;
          *start = *(uchar *)(lVar4 + -1);
          start = start + 1;
        }
        iVar5 = next_code(self);
        if (iVar5 != -1) break;
        *(undefined4 *)((long)pvVar1 + 0x3c) = 0xffffffff;
      }
    } while (iVar5 == 0);
    self_local = (archive_read_filter *)(long)iVar5;
  }
  else {
    *pblock = (void *)0x0;
    self_local = (archive_read_filter *)0x0;
  }
  return (ssize_t)self_local;
}

Assistant:

static ssize_t
compress_filter_read(struct archive_read_filter *self, const void **pblock)
{
	struct private_data *state;
	unsigned char *p, *start, *end;
	int ret;

	state = (struct private_data *)self->data;
	if (state->end_of_stream) {
		*pblock = NULL;
		return (0);
	}
	p = start = (unsigned char *)state->out_block;
	end = start + state->out_block_size;

	while (p < end && !state->end_of_stream) {
		if (state->stackp > state->stack) {
			*p++ = *--state->stackp;
		} else {
			ret = next_code(self);
			if (ret == -1)
				state->end_of_stream = ret;
			else if (ret != ARCHIVE_OK)
				return (ret);
		}
	}

	*pblock = start;
	return (p - start);
}